

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::MatrixMultiply::backward_impl
          (MatrixMultiply *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer ppTVar5;
  Tensor *pTVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  char *pcVar14;
  ulong uVar15;
  uint uVar16;
  ushort uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  int iVar33;
  int iVar34;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_b0;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_90;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  if (1 < i) {
    __assert_fail("i < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                  ,0x595,
                  "virtual void cnn::MatrixMultiply::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  ppTVar5 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar16 = ((*ppTVar5)->d).bd;
  uVar1 = (ppTVar5[1]->d).bd;
  if (uVar1 < uVar16) {
    uVar1 = uVar16;
  }
  if (i == 0) {
    if (0 < (int)uVar1) {
      uVar16 = 0;
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        uVar2 = (dEdf->d).nd;
        iVar33 = 1;
        if ((ulong)uVar2 != 0) {
          auVar24 = vpbroadcastq_avx512f();
          uVar15 = 0;
          auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar26 = vmovdqa64_avx512f(auVar25);
            auVar25 = vpbroadcastq_avx512f();
            auVar27 = vporq_avx512f(auVar25,auVar22);
            auVar25 = vporq_avx512f(auVar25,auVar23);
            uVar10 = vpcmpuq_avx512f(auVar25,auVar24,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar27,auVar24,2);
            bVar12 = (byte)uVar10;
            uVar17 = CONCAT11(bVar12,bVar11);
            auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar15));
            auVar27._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar25._4_4_;
            auVar27._0_4_ = (uint)(bVar11 & 1) * auVar25._0_4_;
            auVar27._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar25._8_4_;
            auVar27._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar25._12_4_;
            auVar27._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar25._16_4_;
            auVar27._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar25._20_4_;
            auVar27._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar25._24_4_;
            auVar27._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar25._28_4_;
            auVar27._32_4_ = (uint)(bVar12 & 1) * auVar25._32_4_;
            auVar27._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar25._36_4_;
            auVar27._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar25._40_4_;
            auVar27._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar25._44_4_;
            auVar27._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar25._48_4_;
            auVar27._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar25._52_4_;
            auVar27._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar25._56_4_;
            auVar27._60_4_ = (uint)(bVar12 >> 7) * auVar25._60_4_;
            auVar25 = vpmulld_avx512f(auVar27,auVar26);
            uVar15 = uVar15 + 0x10;
          } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar15);
          auVar24 = vmovdqa32_avx512f(auVar25);
          auVar25._0_4_ =
               (uint)(bVar11 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._0_4_;
          bVar7 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar25._4_4_ = (uint)bVar7 * auVar24._4_4_ | (uint)!bVar7 * auVar26._4_4_;
          bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar25._8_4_ = (uint)bVar7 * auVar24._8_4_ | (uint)!bVar7 * auVar26._8_4_;
          bVar7 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar25._12_4_ = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * auVar26._12_4_;
          bVar7 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar25._16_4_ = (uint)bVar7 * auVar24._16_4_ | (uint)!bVar7 * auVar26._16_4_;
          bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar25._20_4_ = (uint)bVar7 * auVar24._20_4_ | (uint)!bVar7 * auVar26._20_4_;
          bVar7 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar25._24_4_ = (uint)bVar7 * auVar24._24_4_ | (uint)!bVar7 * auVar26._24_4_;
          bVar7 = (bool)((byte)(uVar17 >> 7) & 1);
          auVar25._28_4_ = (uint)bVar7 * auVar24._28_4_ | (uint)!bVar7 * auVar26._28_4_;
          auVar25._32_4_ =
               (uint)(bVar12 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar26._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar25._36_4_ = (uint)bVar7 * auVar24._36_4_ | (uint)!bVar7 * auVar26._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar25._40_4_ = (uint)bVar7 * auVar24._40_4_ | (uint)!bVar7 * auVar26._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar25._44_4_ = (uint)bVar7 * auVar24._44_4_ | (uint)!bVar7 * auVar26._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar25._48_4_ = (uint)bVar7 * auVar24._48_4_ | (uint)!bVar7 * auVar26._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar25._52_4_ = (uint)bVar7 * auVar24._52_4_ | (uint)!bVar7 * auVar26._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar25._56_4_ = (uint)bVar7 * auVar24._56_4_ | (uint)!bVar7 * auVar26._56_4_;
          auVar25._60_4_ =
               (uint)(bVar12 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar26._60_4_;
          auVar18 = vextracti64x4_avx512f(auVar25,1);
          auVar24 = vpmulld_avx512f(auVar25,ZEXT3264(auVar18));
          auVar8 = vpmulld_avx(auVar24._0_16_,auVar24._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar33 = auVar8._0_4_;
        }
        iVar34 = 1;
        local_b0.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(dEdf->d).d[1];
        if (uVar2 < 2) {
          local_b0.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        pTVar6 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)
                 ._M_impl.super__Vector_impl_data._M_start[1];
        uVar2 = (pTVar6->d).nd;
        if ((ulong)uVar2 != 0) {
          auVar24 = vpbroadcastq_avx512f();
          uVar15 = 0;
          auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar26 = vmovdqa64_avx512f(auVar25);
            auVar25 = vpbroadcastq_avx512f();
            auVar27 = vporq_avx512f(auVar25,auVar22);
            auVar25 = vporq_avx512f(auVar25,auVar23);
            uVar10 = vpcmpuq_avx512f(auVar25,auVar24,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar27,auVar24,2);
            bVar12 = (byte)uVar10;
            uVar17 = CONCAT11(bVar12,bVar11);
            auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar6->d).d + uVar15));
            auVar19._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar25._4_4_;
            auVar19._0_4_ = (uint)(bVar11 & 1) * auVar25._0_4_;
            auVar19._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar25._8_4_;
            auVar19._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar25._12_4_;
            auVar19._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar25._16_4_;
            auVar19._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar25._20_4_;
            auVar19._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar25._24_4_;
            auVar19._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar25._28_4_;
            auVar19._32_4_ = (uint)(bVar12 & 1) * auVar25._32_4_;
            auVar19._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar25._36_4_;
            auVar19._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar25._40_4_;
            auVar19._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar25._44_4_;
            auVar19._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar25._48_4_;
            auVar19._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar25._52_4_;
            auVar19._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar25._56_4_;
            auVar19._60_4_ = (uint)(bVar12 >> 7) * auVar25._60_4_;
            auVar25 = vpmulld_avx512f(auVar19,auVar26);
            uVar15 = uVar15 + 0x10;
          } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar15);
          auVar24 = vmovdqa32_avx512f(auVar25);
          auVar20._0_4_ =
               (uint)(bVar11 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._0_4_;
          bVar7 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar20._4_4_ = (uint)bVar7 * auVar24._4_4_ | (uint)!bVar7 * auVar26._4_4_;
          bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar20._8_4_ = (uint)bVar7 * auVar24._8_4_ | (uint)!bVar7 * auVar26._8_4_;
          bVar7 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar20._12_4_ = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * auVar26._12_4_;
          bVar7 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar20._16_4_ = (uint)bVar7 * auVar24._16_4_ | (uint)!bVar7 * auVar26._16_4_;
          bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar20._20_4_ = (uint)bVar7 * auVar24._20_4_ | (uint)!bVar7 * auVar26._20_4_;
          bVar7 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar20._24_4_ = (uint)bVar7 * auVar24._24_4_ | (uint)!bVar7 * auVar26._24_4_;
          bVar7 = (bool)((byte)(uVar17 >> 7) & 1);
          auVar20._28_4_ = (uint)bVar7 * auVar24._28_4_ | (uint)!bVar7 * auVar26._28_4_;
          auVar20._32_4_ =
               (uint)(bVar12 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar26._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar20._36_4_ = (uint)bVar7 * auVar24._36_4_ | (uint)!bVar7 * auVar26._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar20._40_4_ = (uint)bVar7 * auVar24._40_4_ | (uint)!bVar7 * auVar26._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar20._44_4_ = (uint)bVar7 * auVar24._44_4_ | (uint)!bVar7 * auVar26._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar20._48_4_ = (uint)bVar7 * auVar24._48_4_ | (uint)!bVar7 * auVar26._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar20._52_4_ = (uint)bVar7 * auVar24._52_4_ | (uint)!bVar7 * auVar26._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar20._56_4_ = (uint)bVar7 * auVar24._56_4_ | (uint)!bVar7 * auVar26._56_4_;
          auVar20._60_4_ =
               (uint)(bVar12 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar26._60_4_;
          auVar18 = vextracti64x4_avx512f(auVar20,1);
          auVar24 = vpmulld_avx512f(auVar20,ZEXT3264(auVar18));
          auVar8 = vpmulld_avx(auVar24._0_16_,auVar24._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar34 = auVar8._0_4_;
        }
        local_b0.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdf->v + (uVar16 % (dEdf->d).bd) * iVar33;
        uVar3 = (dEdf->d).d[0];
        local_b0.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar3;
        local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = pTVar6->v + (uVar16 % (pTVar6->d).bd) * iVar34;
        local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)(pTVar6->d).d[0];
        local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(pTVar6->d).d[1];
        if (uVar2 < 2) {
          local_90.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        if ((int)local_b0.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value !=
            (int)local_90.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value) {
          pcVar14 = 
          "Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Option = 0]"
          ;
          goto LAB_001816e8;
        }
        uVar2 = (dEdxi->d).nd;
        if ((ulong)uVar2 == 0) {
          iVar33 = 1;
        }
        else {
          auVar24 = vpbroadcastq_avx512f();
          uVar15 = 0;
          auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar26 = vmovdqa64_avx512f(auVar25);
            auVar25 = vpbroadcastq_avx512f();
            auVar27 = vporq_avx512f(auVar25,auVar22);
            auVar25 = vporq_avx512f(auVar25,auVar23);
            uVar10 = vpcmpuq_avx512f(auVar25,auVar24,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar27,auVar24,2);
            bVar12 = (byte)uVar10;
            uVar17 = CONCAT11(bVar12,bVar11);
            auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar15));
            auVar21._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar25._4_4_;
            auVar21._0_4_ = (uint)(bVar11 & 1) * auVar25._0_4_;
            auVar21._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar25._8_4_;
            auVar21._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar25._12_4_;
            auVar21._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar25._16_4_;
            auVar21._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar25._20_4_;
            auVar21._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar25._24_4_;
            auVar21._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar25._28_4_;
            auVar21._32_4_ = (uint)(bVar12 & 1) * auVar25._32_4_;
            auVar21._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar25._36_4_;
            auVar21._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar25._40_4_;
            auVar21._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar25._44_4_;
            auVar21._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar25._48_4_;
            auVar21._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar25._52_4_;
            auVar21._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar25._56_4_;
            auVar21._60_4_ = (uint)(bVar12 >> 7) * auVar25._60_4_;
            auVar25 = vpmulld_avx512f(auVar21,auVar26);
            uVar15 = uVar15 + 0x10;
          } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar15);
          auVar22 = vmovdqa32_avx512f(auVar25);
          auVar23._0_4_ =
               (uint)(bVar11 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._0_4_;
          bVar7 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar23._4_4_ = (uint)bVar7 * auVar22._4_4_ | (uint)!bVar7 * auVar26._4_4_;
          bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar23._8_4_ = (uint)bVar7 * auVar22._8_4_ | (uint)!bVar7 * auVar26._8_4_;
          bVar7 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar23._12_4_ = (uint)bVar7 * auVar22._12_4_ | (uint)!bVar7 * auVar26._12_4_;
          bVar7 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar23._16_4_ = (uint)bVar7 * auVar22._16_4_ | (uint)!bVar7 * auVar26._16_4_;
          bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar23._20_4_ = (uint)bVar7 * auVar22._20_4_ | (uint)!bVar7 * auVar26._20_4_;
          bVar7 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar23._24_4_ = (uint)bVar7 * auVar22._24_4_ | (uint)!bVar7 * auVar26._24_4_;
          bVar7 = (bool)((byte)(uVar17 >> 7) & 1);
          auVar23._28_4_ = (uint)bVar7 * auVar22._28_4_ | (uint)!bVar7 * auVar26._28_4_;
          auVar23._32_4_ =
               (uint)(bVar12 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar26._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar23._36_4_ = (uint)bVar7 * auVar22._36_4_ | (uint)!bVar7 * auVar26._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar23._40_4_ = (uint)bVar7 * auVar22._40_4_ | (uint)!bVar7 * auVar26._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar23._44_4_ = (uint)bVar7 * auVar22._44_4_ | (uint)!bVar7 * auVar26._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar23._48_4_ = (uint)bVar7 * auVar22._48_4_ | (uint)!bVar7 * auVar26._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar23._52_4_ = (uint)bVar7 * auVar22._52_4_ | (uint)!bVar7 * auVar26._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar23._56_4_ = (uint)bVar7 * auVar22._56_4_ | (uint)!bVar7 * auVar26._56_4_;
          auVar23._60_4_ =
               (uint)(bVar12 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar26._60_4_;
          auVar18 = vextracti64x4_avx512f(auVar23,1);
          auVar22 = vpmulld_avx512f(auVar23,ZEXT3264(auVar18));
          auVar8 = vpmulld_avx(auVar22._0_16_,auVar22._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar33 = auVar8._0_4_;
        }
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdxi->v + (uVar16 % (dEdxi->d).bd) * iVar33;
        uVar4 = (dEdxi->d).d[0];
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar4;
        uVar13 = (dEdxi->d).d[1];
        if (uVar2 < 2) {
          uVar13 = 1;
        }
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)uVar13;
        if ((uVar4 != uVar3) ||
           (local_90.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value !=
            local_70.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value)) {
          pcVar14 = 
          "static void Eigen::internal::Assignment<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>, Eigen::internal::add_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>, Functor = Eigen::internal::add_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
          ;
          goto LAB_0018170a;
        }
        Eigen::internal::
        generic_product_impl<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::DenseShape,Eigen::DenseShape,8>
        ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                  (&local_70,&local_b0,
                   (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&local_90);
        uVar16 = uVar16 + 1;
        auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      } while (uVar16 != uVar1);
    }
  }
  else if (uVar16 == 1) {
    Tensor::operator*(&local_70,*ppTVar5);
    local_90.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = dEdf->v;
    local_90.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = (long)(dEdf->d).d[0];
    uVar16 = 1;
    if (1 < (dEdf->d).nd) {
      uVar16 = (dEdf->d).d[1];
    }
    local_90.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = (long)(uVar16 * (dEdf->d).bd);
    local_b0.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = local_70.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
    local_b0.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value =
         local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    local_b0.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value =
         local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    if (local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value !=
        local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value) {
LAB_001816d3:
      pcVar14 = 
      "Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Rhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Option = 0]"
      ;
LAB_001816e8:
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar14);
    }
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = dEdxi->v;
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = (long)(dEdxi->d).d[0];
    uVar16 = 1;
    if (1 < (dEdxi->d).nd) {
      uVar16 = (dEdxi->d).d[1];
    }
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = (long)(uVar16 * (dEdxi->d).bd);
    if ((local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value !=
         local_50.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value) ||
       (local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value !=
        local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value)) {
LAB_001816f5:
      pcVar14 = 
      "static void Eigen::internal::Assignment<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::internal::add_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
      ;
LAB_0018170a:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,pcVar14);
    }
    Eigen::internal::
    generic_product_impl<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
              (&local_50,
               (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&local_b0,&local_90);
  }
  else if (0 < (int)uVar1) {
    uVar16 = 0;
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      pTVar6 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar2 = (pTVar6->d).nd;
      iVar33 = 1;
      if ((ulong)uVar2 != 0) {
        auVar24 = vpbroadcastq_avx512f();
        uVar15 = 0;
        auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar26 = vmovdqa64_avx512f(auVar25);
          auVar25 = vpbroadcastq_avx512f();
          auVar27 = vporq_avx512f(auVar25,auVar22);
          auVar25 = vporq_avx512f(auVar25,auVar23);
          uVar10 = vpcmpuq_avx512f(auVar25,auVar24,2);
          bVar11 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar27,auVar24,2);
          bVar12 = (byte)uVar10;
          uVar17 = CONCAT11(bVar12,bVar11);
          auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar6->d).d + uVar15));
          auVar28._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar25._4_4_;
          auVar28._0_4_ = (uint)(bVar11 & 1) * auVar25._0_4_;
          auVar28._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar25._8_4_;
          auVar28._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar25._12_4_;
          auVar28._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar25._16_4_;
          auVar28._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar25._20_4_;
          auVar28._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar25._24_4_;
          auVar28._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar25._28_4_;
          auVar28._32_4_ = (uint)(bVar12 & 1) * auVar25._32_4_;
          auVar28._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar25._36_4_;
          auVar28._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar25._40_4_;
          auVar28._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar25._44_4_;
          auVar28._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar25._48_4_;
          auVar28._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar25._52_4_;
          auVar28._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar25._56_4_;
          auVar28._60_4_ = (uint)(bVar12 >> 7) * auVar25._60_4_;
          auVar25 = vpmulld_avx512f(auVar28,auVar26);
          uVar15 = uVar15 + 0x10;
        } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar15);
        auVar24 = vmovdqa32_avx512f(auVar25);
        auVar29._0_4_ =
             (uint)(bVar11 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._0_4_;
        bVar7 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar29._4_4_ = (uint)bVar7 * auVar24._4_4_ | (uint)!bVar7 * auVar26._4_4_;
        bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar29._8_4_ = (uint)bVar7 * auVar24._8_4_ | (uint)!bVar7 * auVar26._8_4_;
        bVar7 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar29._12_4_ = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * auVar26._12_4_;
        bVar7 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar29._16_4_ = (uint)bVar7 * auVar24._16_4_ | (uint)!bVar7 * auVar26._16_4_;
        bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar29._20_4_ = (uint)bVar7 * auVar24._20_4_ | (uint)!bVar7 * auVar26._20_4_;
        bVar7 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar29._24_4_ = (uint)bVar7 * auVar24._24_4_ | (uint)!bVar7 * auVar26._24_4_;
        bVar7 = (bool)((byte)(uVar17 >> 7) & 1);
        auVar29._28_4_ = (uint)bVar7 * auVar24._28_4_ | (uint)!bVar7 * auVar26._28_4_;
        auVar29._32_4_ =
             (uint)(bVar12 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar26._32_4_;
        bVar7 = (bool)(bVar12 >> 1 & 1);
        auVar29._36_4_ = (uint)bVar7 * auVar24._36_4_ | (uint)!bVar7 * auVar26._36_4_;
        bVar7 = (bool)(bVar12 >> 2 & 1);
        auVar29._40_4_ = (uint)bVar7 * auVar24._40_4_ | (uint)!bVar7 * auVar26._40_4_;
        bVar7 = (bool)(bVar12 >> 3 & 1);
        auVar29._44_4_ = (uint)bVar7 * auVar24._44_4_ | (uint)!bVar7 * auVar26._44_4_;
        bVar7 = (bool)(bVar12 >> 4 & 1);
        auVar29._48_4_ = (uint)bVar7 * auVar24._48_4_ | (uint)!bVar7 * auVar26._48_4_;
        bVar7 = (bool)(bVar12 >> 5 & 1);
        auVar29._52_4_ = (uint)bVar7 * auVar24._52_4_ | (uint)!bVar7 * auVar26._52_4_;
        bVar7 = (bool)(bVar12 >> 6 & 1);
        auVar29._56_4_ = (uint)bVar7 * auVar24._56_4_ | (uint)!bVar7 * auVar26._56_4_;
        auVar29._60_4_ =
             (uint)(bVar12 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar26._60_4_;
        auVar18 = vextracti64x4_avx512f(auVar29,1);
        auVar24 = vpmulld_avx512f(auVar29,ZEXT3264(auVar18));
        auVar8 = vpmulld_avx(auVar24._0_16_,auVar24._16_16_);
        auVar9 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        auVar9 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        iVar33 = auVar8._0_4_;
      }
      iVar34 = 1;
      local_b0.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(pTVar6->d).d[1];
      if (uVar2 < 2) {
        local_b0.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = 1;
      }
      uVar2 = (dEdf->d).nd;
      if ((ulong)uVar2 != 0) {
        auVar24 = vpbroadcastq_avx512f();
        uVar15 = 0;
        auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar26 = vmovdqa64_avx512f(auVar25);
          auVar25 = vpbroadcastq_avx512f();
          auVar27 = vporq_avx512f(auVar25,auVar22);
          auVar25 = vporq_avx512f(auVar25,auVar23);
          uVar10 = vpcmpuq_avx512f(auVar25,auVar24,2);
          bVar11 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar27,auVar24,2);
          bVar12 = (byte)uVar10;
          uVar17 = CONCAT11(bVar12,bVar11);
          auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar15));
          auVar30._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar25._4_4_;
          auVar30._0_4_ = (uint)(bVar11 & 1) * auVar25._0_4_;
          auVar30._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar25._8_4_;
          auVar30._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar25._12_4_;
          auVar30._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar25._16_4_;
          auVar30._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar25._20_4_;
          auVar30._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar25._24_4_;
          auVar30._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar25._28_4_;
          auVar30._32_4_ = (uint)(bVar12 & 1) * auVar25._32_4_;
          auVar30._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar25._36_4_;
          auVar30._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar25._40_4_;
          auVar30._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar25._44_4_;
          auVar30._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar25._48_4_;
          auVar30._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar25._52_4_;
          auVar30._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar25._56_4_;
          auVar30._60_4_ = (uint)(bVar12 >> 7) * auVar25._60_4_;
          auVar25 = vpmulld_avx512f(auVar30,auVar26);
          uVar15 = uVar15 + 0x10;
        } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar15);
        auVar24 = vmovdqa32_avx512f(auVar25);
        auVar31._0_4_ =
             (uint)(bVar11 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._0_4_;
        bVar7 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar31._4_4_ = (uint)bVar7 * auVar24._4_4_ | (uint)!bVar7 * auVar26._4_4_;
        bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar31._8_4_ = (uint)bVar7 * auVar24._8_4_ | (uint)!bVar7 * auVar26._8_4_;
        bVar7 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar31._12_4_ = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * auVar26._12_4_;
        bVar7 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar31._16_4_ = (uint)bVar7 * auVar24._16_4_ | (uint)!bVar7 * auVar26._16_4_;
        bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar31._20_4_ = (uint)bVar7 * auVar24._20_4_ | (uint)!bVar7 * auVar26._20_4_;
        bVar7 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar31._24_4_ = (uint)bVar7 * auVar24._24_4_ | (uint)!bVar7 * auVar26._24_4_;
        bVar7 = (bool)((byte)(uVar17 >> 7) & 1);
        auVar31._28_4_ = (uint)bVar7 * auVar24._28_4_ | (uint)!bVar7 * auVar26._28_4_;
        auVar31._32_4_ =
             (uint)(bVar12 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar26._32_4_;
        bVar7 = (bool)(bVar12 >> 1 & 1);
        auVar31._36_4_ = (uint)bVar7 * auVar24._36_4_ | (uint)!bVar7 * auVar26._36_4_;
        bVar7 = (bool)(bVar12 >> 2 & 1);
        auVar31._40_4_ = (uint)bVar7 * auVar24._40_4_ | (uint)!bVar7 * auVar26._40_4_;
        bVar7 = (bool)(bVar12 >> 3 & 1);
        auVar31._44_4_ = (uint)bVar7 * auVar24._44_4_ | (uint)!bVar7 * auVar26._44_4_;
        bVar7 = (bool)(bVar12 >> 4 & 1);
        auVar31._48_4_ = (uint)bVar7 * auVar24._48_4_ | (uint)!bVar7 * auVar26._48_4_;
        bVar7 = (bool)(bVar12 >> 5 & 1);
        auVar31._52_4_ = (uint)bVar7 * auVar24._52_4_ | (uint)!bVar7 * auVar26._52_4_;
        bVar7 = (bool)(bVar12 >> 6 & 1);
        auVar31._56_4_ = (uint)bVar7 * auVar24._56_4_ | (uint)!bVar7 * auVar26._56_4_;
        auVar31._60_4_ =
             (uint)(bVar12 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar26._60_4_;
        auVar18 = vextracti64x4_avx512f(auVar31,1);
        auVar24 = vpmulld_avx512f(auVar31,ZEXT3264(auVar18));
        auVar8 = vpmulld_avx(auVar24._0_16_,auVar24._16_16_);
        auVar9 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        auVar9 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        iVar34 = auVar8._0_4_;
      }
      local_b0.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pTVar6->v + (uVar16 % (pTVar6->d).bd) * iVar33;
      uVar3 = (pTVar6->d).d[0];
      local_b0.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)uVar3;
      local_90.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdf->v + (uVar16 % (dEdf->d).bd) * iVar34;
      uVar4 = (dEdf->d).d[0];
      local_90.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)uVar4;
      local_90.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(dEdf->d).d[1];
      if (uVar2 < 2) {
        local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = 1;
      }
      if (uVar3 != uVar4) goto LAB_001816d3;
      uVar2 = (dEdxi->d).nd;
      if ((ulong)uVar2 == 0) {
        iVar33 = 1;
      }
      else {
        auVar24 = vpbroadcastq_avx512f();
        uVar15 = 0;
        auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar26 = vmovdqa64_avx512f(auVar25);
          auVar25 = vpbroadcastq_avx512f();
          auVar27 = vporq_avx512f(auVar25,auVar22);
          auVar25 = vporq_avx512f(auVar25,auVar23);
          uVar10 = vpcmpuq_avx512f(auVar25,auVar24,2);
          bVar11 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar27,auVar24,2);
          bVar12 = (byte)uVar10;
          uVar17 = CONCAT11(bVar12,bVar11);
          auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar15));
          auVar32._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar25._4_4_;
          auVar32._0_4_ = (uint)(bVar11 & 1) * auVar25._0_4_;
          auVar32._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar25._8_4_;
          auVar32._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar25._12_4_;
          auVar32._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar25._16_4_;
          auVar32._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar25._20_4_;
          auVar32._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar25._24_4_;
          auVar32._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar25._28_4_;
          auVar32._32_4_ = (uint)(bVar12 & 1) * auVar25._32_4_;
          auVar32._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar25._36_4_;
          auVar32._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar25._40_4_;
          auVar32._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar25._44_4_;
          auVar32._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar25._48_4_;
          auVar32._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar25._52_4_;
          auVar32._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar25._56_4_;
          auVar32._60_4_ = (uint)(bVar12 >> 7) * auVar25._60_4_;
          auVar25 = vpmulld_avx512f(auVar32,auVar26);
          uVar15 = uVar15 + 0x10;
        } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar15);
        auVar22 = vmovdqa32_avx512f(auVar25);
        auVar24._0_4_ =
             (uint)(bVar11 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._0_4_;
        bVar7 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar24._4_4_ = (uint)bVar7 * auVar22._4_4_ | (uint)!bVar7 * auVar26._4_4_;
        bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar24._8_4_ = (uint)bVar7 * auVar22._8_4_ | (uint)!bVar7 * auVar26._8_4_;
        bVar7 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar24._12_4_ = (uint)bVar7 * auVar22._12_4_ | (uint)!bVar7 * auVar26._12_4_;
        bVar7 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar24._16_4_ = (uint)bVar7 * auVar22._16_4_ | (uint)!bVar7 * auVar26._16_4_;
        bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar24._20_4_ = (uint)bVar7 * auVar22._20_4_ | (uint)!bVar7 * auVar26._20_4_;
        bVar7 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar24._24_4_ = (uint)bVar7 * auVar22._24_4_ | (uint)!bVar7 * auVar26._24_4_;
        bVar7 = (bool)((byte)(uVar17 >> 7) & 1);
        auVar24._28_4_ = (uint)bVar7 * auVar22._28_4_ | (uint)!bVar7 * auVar26._28_4_;
        auVar24._32_4_ =
             (uint)(bVar12 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar26._32_4_;
        bVar7 = (bool)(bVar12 >> 1 & 1);
        auVar24._36_4_ = (uint)bVar7 * auVar22._36_4_ | (uint)!bVar7 * auVar26._36_4_;
        bVar7 = (bool)(bVar12 >> 2 & 1);
        auVar24._40_4_ = (uint)bVar7 * auVar22._40_4_ | (uint)!bVar7 * auVar26._40_4_;
        bVar7 = (bool)(bVar12 >> 3 & 1);
        auVar24._44_4_ = (uint)bVar7 * auVar22._44_4_ | (uint)!bVar7 * auVar26._44_4_;
        bVar7 = (bool)(bVar12 >> 4 & 1);
        auVar24._48_4_ = (uint)bVar7 * auVar22._48_4_ | (uint)!bVar7 * auVar26._48_4_;
        bVar7 = (bool)(bVar12 >> 5 & 1);
        auVar24._52_4_ = (uint)bVar7 * auVar22._52_4_ | (uint)!bVar7 * auVar26._52_4_;
        bVar7 = (bool)(bVar12 >> 6 & 1);
        auVar24._56_4_ = (uint)bVar7 * auVar22._56_4_ | (uint)!bVar7 * auVar26._56_4_;
        auVar24._60_4_ =
             (uint)(bVar12 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar26._60_4_;
        auVar18 = vextracti64x4_avx512f(auVar24,1);
        auVar22 = vpmulld_avx512f(auVar24,ZEXT3264(auVar18));
        auVar8 = vpmulld_avx(auVar22._0_16_,auVar22._16_16_);
        auVar9 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        auVar9 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        iVar33 = auVar8._0_4_;
      }
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdxi->v + (uVar16 % (dEdxi->d).bd) * iVar33;
      uVar3 = (dEdxi->d).d[0];
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)uVar3;
      uVar4 = (dEdxi->d).d[1];
      if (uVar2 < 2) {
        uVar4 = 1;
      }
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)uVar4;
      if ((uVar3 != (uint)local_b0.
                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_cols.m_value) ||
         (local_90.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value !=
          local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value)) goto LAB_001816f5;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                (&local_70,
                 (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_b0,&local_90);
      uVar16 = uVar16 + 1;
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (uVar16 != uVar1);
  }
  return;
}

Assistant:

void MatrixMultiply::backward_impl(const vector<const Tensor*>& xs,
                                const Tensor& fx,
                                const Tensor& dEdf,
                                unsigned i,
                                Tensor& dEdxi) const {
  assert(i < 2);
  int max_b = max(xs[0]->d.bd, xs[1]->d.bd);
#if HAVE_CUDA
  if (i == 0) {
    for(int b = 0; b < max_b; ++b)
      CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_N, CUBLAS_OP_T,
            dEdxi.d.rows(), dEdxi.d.cols(), dEdf.d.cols(),
            kSCALAR_ONE,
            dEdf.batch_ptr(b), dEdf.d.rows(),
            xs[1]->batch_ptr(b), xs[1]->d.rows(),
            kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
  } else {
    // TODO: Fix this to share
    for(int b = 0; b < max_b; ++b)
      CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N,
            dEdxi.d.rows(), dEdxi.d.cols(), xs[0]->d.rows(),
            kSCALAR_ONE,
            xs[0]->batch_ptr(b), xs[0]->d.rows(),
            dEdf.batch_ptr(b), dEdf.d.rows(),
            kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
  }
#else
  if (i == 0) {
    for(int b = 0; b < max_b; ++b)
      dEdxi.batch_matrix(b).noalias() += dEdf.batch_matrix(b) * xs[1]->batch_matrix(b).transpose();
  } else {
    if(xs[0]->d.bd == 1) {
      dEdxi.colbatch_matrix().noalias() += (**xs[0]).transpose() * dEdf.colbatch_matrix();
    } else {
      for(int b = 0; b < max_b; ++b)
        dEdxi.batch_matrix(b).noalias() += xs[0]->batch_matrix(b).transpose() * dEdf.batch_matrix(b);
    }
  }
#endif
}